

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

bool __thiscall
tonk::OutgoingQueue::Append
          (OutgoingQueue *this,uint messageType,uint8_t *messageData,uint messageBytes)

{
  uint uVar1;
  OutgoingQueuedDatagram *pOVar2;
  uint uVar3;
  
  pOVar2 = this->OutBuffer;
  if (pOVar2 != (OutgoingQueuedDatagram *)0x0) {
    uVar1 = pOVar2->NextWriteOffset;
    uVar3 = uVar1 + 2 + messageBytes;
    if (uVar3 <= this->Common->MaxMessageSectionBytes) {
      *(ushort *)(pOVar2->Data + (ulong)uVar1 + 2 + -2) =
           (ushort)(messageType << 0xb) | (ushort)messageBytes;
      memcpy(pOVar2->Data + (ulong)uVar1 + 2,messageData,(ulong)messageBytes);
      pOVar2->NextWriteOffset = uVar3;
      this->QueuedBytes = this->QueuedBytes + messageBytes + 2;
      return true;
    }
  }
  return false;
}

Assistant:

bool OutgoingQueue::Append(
    unsigned messageType,
    const uint8_t* messageData,
    unsigned messageBytes)
{
    TONK_VERBOSE_OUTGOING_LOG("OutgoingQueue::Append messageType=", messageType,
        " messageBytes=", messageBytes, " OutBuffer=", OutBuffer);

    OutgoingQueuedDatagram* datagram = OutBuffer;
    if (!datagram)
    {
        TONK_VERBOSE_OUTGOING_LOG("Append: OutBuffer is null - abort");
        return false;
    }

    const unsigned writeBytes = static_cast<unsigned>(
        protocol::kMessageFrameBytes + messageBytes);
    const unsigned nextWriteOffset = datagram->NextWriteOffset;

    if (nextWriteOffset + writeBytes > Common->MaxMessageSectionBytes)
    {
        TONK_VERBOSE_OUTGOING_LOG("Append: nextWriteOffset=", nextWriteOffset,
            " + writeBytes=", writeBytes, " > ", Common->MaxMessageSectionBytes);
        return false;
    }

    uint8_t* messagePtr = datagram->Data + nextWriteOffset;

    // Write 2-byte message frame header
    protocol::WriteMessageFrameHeader(messagePtr, messageType, messageBytes);

    // Copy message into place
    memcpy(messagePtr + protocol::kMessageFrameBytes, messageData, messageBytes);

    // Record that the data was written
    datagram->NextWriteOffset = nextWriteOffset + writeBytes;

    // Update queued bytes
    QueuedBytes += writeBytes;

    TONK_VERBOSE_OUTGOING_LOG("Append: WROTE TO DATAGRAM datagram->NextWriteOffset=",
        datagram->NextWriteOffset, " + writeBytes=", writeBytes, " MaxMessageSectionBytes=",
        Common->MaxMessageSectionBytes, " QueuedBytes=", QueuedBytes);

#ifdef TONK_DETAILED_STATS
    datagram->AddMessageStats(messageType, messageBytes);
#endif // TONK_DETAILED_STATS

    return true;
}